

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O0

vector<State,_std::allocator<State>_> * __thiscall
Problem::fringeExpander
          (vector<State,_std::allocator<State>_> *__return_storage_ptr__,Problem *this,
          vector<State,_std::allocator<State>_> *fringe,int fringeSize,int expanderCode)

{
  bool bVar1;
  ostream *this_00;
  iterator __first;
  iterator __last;
  reference pSVar2;
  vector<State,_std::allocator<State>_> local_178;
  vector<State,_std::allocator<State>_> local_160;
  vector<State,_std::allocator<State>_> local_148;
  vector<State,_std::allocator<State>_> local_130;
  undefined1 local_111;
  State *local_110;
  undefined1 local_108 [8];
  State state;
  __normal_iterator<State_*,_std::vector<State,_std::allocator<State>_>_> local_d8;
  iterator it_1;
  __normal_iterator<State_*,_std::vector<State,_std::allocator<State>_>_> local_b0;
  const_iterator local_a8;
  State local_a0;
  undefined1 local_78 [8];
  vector<State,_std::allocator<State>_> neighbours;
  __normal_iterator<State_*,_std::vector<State,_std::allocator<State>_>_> local_58;
  iterator it;
  undefined1 local_40 [8];
  vector<State,_std::allocator<State>_> newfringe;
  int expanderCode_local;
  int fringeSize_local;
  vector<State,_std::allocator<State>_> *fringe_local;
  Problem *this_local;
  vector<State,_std::allocator<State>_> *expandedfringe;
  
  newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = expanderCode;
  newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = fringeSize;
  std::vector<State,_std::allocator<State>_>::vector
            ((vector<State,_std::allocator<State>_> *)local_40,fringe);
  this_00 = std::operator<<((ostream *)&std::cout,"Expanding fringe");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_58._M_current = (State *)std::vector<State,_std::allocator<State>_>::begin(fringe);
  while( true ) {
    neighbours.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)std::vector<State,_std::allocator<State>_>::end(fringe);
    bVar1 = __gnu_cxx::operator<
                      (&local_58,
                       (__normal_iterator<State_*,_std::vector<State,_std::allocator<State>_>_> *)
                       &neighbours.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::__normal_iterator<State_*,_std::vector<State,_std::allocator<State>_>_>::
             operator*(&local_58);
    State::State(&local_a0,pSVar2);
    getNeighbours((vector<State,_std::allocator<State>_> *)local_78,this,&local_a0);
    State::~State(&local_a0);
    local_b0._M_current =
         (State *)std::vector<State,_std::allocator<State>_>::end
                            ((vector<State,_std::allocator<State>_> *)local_40);
    __gnu_cxx::__normal_iterator<State_const*,std::vector<State,std::allocator<State>>>::
    __normal_iterator<State*>
              ((__normal_iterator<State_const*,std::vector<State,std::allocator<State>>> *)&local_a8
               ,&local_b0);
    __first = std::vector<State,_std::allocator<State>_>::begin
                        ((vector<State,_std::allocator<State>_> *)local_78);
    __last = std::vector<State,_std::allocator<State>_>::end
                       ((vector<State,_std::allocator<State>_> *)local_78);
    std::vector<State,std::allocator<State>>::
    insert<__gnu_cxx::__normal_iterator<State*,std::vector<State,std::allocator<State>>>,void>
              ((vector<State,std::allocator<State>> *)local_40,local_a8,
               (__normal_iterator<State_*,_std::vector<State,_std::allocator<State>_>_>)
               __first._M_current,
               (__normal_iterator<State_*,_std::vector<State,_std::allocator<State>_>_>)
               __last._M_current);
    std::vector<State,_std::allocator<State>_>::~vector
              ((vector<State,_std::allocator<State>_> *)local_78);
    it_1._M_current =
         (State *)__gnu_cxx::__normal_iterator<State_*,_std::vector<State,_std::allocator<State>_>_>
                  ::operator++(&local_58,0);
  }
  local_d8._M_current =
       (State *)std::vector<State,_std::allocator<State>_>::begin
                          ((vector<State,_std::allocator<State>_> *)local_40);
  while( true ) {
    state._32_8_ = std::vector<State,_std::allocator<State>_>::end
                             ((vector<State,_std::allocator<State>_> *)local_40);
    bVar1 = __gnu_cxx::operator<
                      (&local_d8,
                       (__normal_iterator<State_*,_std::vector<State,_std::allocator<State>_>_> *)
                       &state.numConflicts);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::__normal_iterator<State_*,_std::vector<State,_std::allocator<State>_>_>::
             operator*(&local_d8);
    State::State((State *)local_108,pSVar2);
    bVar1 = State::isValid((State *)local_108);
    if (bVar1) {
      std::priority_queue<State,_std::vector<State,_std::allocator<State>_>,_CompareState>::push
                (&this->validStateStore,(value_type *)local_108);
    }
    std::priority_queue<State,_std::vector<State,_std::allocator<State>_>,_CompareState>::size
              (&this->validStateStore);
    State::~State((State *)local_108);
    local_110 = (State *)__gnu_cxx::
                         __normal_iterator<State_*,_std::vector<State,_std::allocator<State>_>_>::
                         operator++(&local_d8,0);
  }
  local_111 = 0;
  std::vector<State,_std::allocator<State>_>::vector(__return_storage_ptr__);
  if ((int)newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage == 0) {
    std::vector<State,_std::allocator<State>_>::vector
              (&local_148,(vector<State,_std::allocator<State>_> *)local_40);
    localGreedyExpander(&local_130,this,&local_148,
                        newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<State,_std::allocator<State>_>::operator=(__return_storage_ptr__,&local_130);
    std::vector<State,_std::allocator<State>_>::~vector(&local_130);
    std::vector<State,_std::allocator<State>_>::~vector(&local_148);
  }
  else {
    std::vector<State,_std::allocator<State>_>::vector
              (&local_178,(vector<State,_std::allocator<State>_> *)local_40);
    localGreedyExpander(&local_160,this,&local_178,
                        newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<State,_std::allocator<State>_>::operator=(__return_storage_ptr__,&local_160);
    std::vector<State,_std::allocator<State>_>::~vector(&local_160);
    std::vector<State,_std::allocator<State>_>::~vector(&local_178);
  }
  local_111 = 1;
  std::vector<State,_std::allocator<State>_>::~vector
            ((vector<State,_std::allocator<State>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

vector<State> Problem::fringeExpander(vector<State> fringe, int fringeSize, int expanderCode) {
    // Initialize new fringe with old fringe
    vector<State> newfringe(fringe);
    cout<<"Expanding fringe"<<endl;

    // TODO: improve method to form new fringe without using enormous space each time
    // Algorithm has much less running time for fringeSize=1 -> Re-implement
    for (auto it = fringe.begin(); it < fringe.end(); it++) {
        vector<State> neighbours = getNeighbours(*it);
        newfringe.insert(newfringe.end(), neighbours.begin(), neighbours.end());
    }

    // Update validStateStore if valid state found among neighbours
    for (auto it = newfringe.begin(); it < newfringe.end(); it++) {
        State state = *it;
        if (state.isValid()) {
            validStateStore.push(state);
        }
        if (validStateStore.size() > validStoreSize) {
            // validStateStore.pop();                  //Question: Won't this remove the best states???????
        }
    }

    // Carry out operation according to expanderCode
    /*
     * Codes for expander functions
     * 0 : greedy expander
     */
    vector<State> expandedfringe;
    switch (expanderCode) {
        case 0:
            expandedfringe = localGreedyExpander(newfringe, fringeSize);
            break;

        default:
            expandedfringe = localGreedyExpander(newfringe, fringeSize);
            break;
    }

    return expandedfringe;
}